

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O1

string * sago::getConfigHome_abi_cxx11_(void)

{
  string *in_RDI;
  
  getLinuxFolderDefault_abi_cxx11_(in_RDI,"XDG_CONFIG_HOME",".config");
  return in_RDI;
}

Assistant:

std::string getConfigHome() {
#ifdef _WIN32
	return GetAppData();
#elif defined(__APPLE__)
	return sago::internal::getHome()+"/Library/Application Support";
#else
	return getLinuxFolderDefault("XDG_CONFIG_HOME", ".config");
#endif
}